

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O2

int Abc_NtkGetAigNodeNum(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Abc_Obj_t *pAVar2;
  int i;
  int iVar3;
  
  if ((pNtk->ntkFunc == ABC_FUNC_AIG) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    i = 0;
    iVar3 = 0;
    do {
      if (pNtk->vObjs->nSize <= i) {
        return iVar3;
      }
      pAVar2 = Abc_NtkObj(pNtk,i);
      if ((pAVar2 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar2->field_0x14 & 0xf) == 7)) {
        if ((Hop_Obj_t *)(pAVar2->field_5).pData == (Hop_Obj_t *)0x0) {
          __assert_fail("pNode->pData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                        ,0x119,"int Abc_NtkGetAigNodeNum(Abc_Ntk_t *)");
        }
        if (1 < (pAVar2->vFanins).nSize) {
          iVar1 = Hop_DagSize((Hop_Obj_t *)(pAVar2->field_5).pData);
          iVar3 = iVar3 + iVar1;
        }
      }
      i = i + 1;
    } while( true );
  }
  __assert_fail("Abc_NtkIsAigLogic(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcUtil.c"
                ,0x116,"int Abc_NtkGetAigNodeNum(Abc_Ntk_t *)");
}

Assistant:

int Abc_NtkGetAigNodeNum( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, nNodes = 0;
    assert( Abc_NtkIsAigLogic(pNtk) );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        assert( pNode->pData );
        if ( Abc_ObjFaninNum(pNode) < 2 )
            continue;
//printf( "%d ", Hop_DagSize( pNode->pData ) );
        nNodes += pNode->pData? Hop_DagSize( (Hop_Obj_t *)pNode->pData ) : 0;
    }
    return nNodes;
}